

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type_info.hpp
# Opt level: O1

vector<person,_std::allocator<person>_> *
lightconf::value_type_info<std::vector<person,_std::allocator<person>_>_>::extract_value
          (vector<person,_std::allocator<person>_> *__return_storage_ptr__,value *val)

{
  pointer pvVar1;
  runtime_error *this;
  pointer this_00;
  undefined1 local_a0 [40];
  _Alloc_hider local_78;
  size_type *local_68 [2];
  pointer local_58;
  
  (__return_storage_ptr__->super__Vector_base<person,_std::allocator<person>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<person,_std::allocator<person>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<person,_std::allocator<person>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (val->type_ == vector_type) {
    this_00 = (val->vector_value_).
              super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>._M_impl.
              super__Vector_impl_data._M_start;
    pvVar1 = (val->vector_value_).
             super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (this_00 != pvVar1) {
      do {
        value::get<person>((return_type<person> *)local_a0,this_00);
        std::vector<person,_std::allocator<person>_>::emplace_back<person>
                  (__return_storage_ptr__,(return_type<person> *)local_a0);
        if (local_58 != (pointer)0x0) {
          operator_delete(local_58);
        }
        if ((size_type **)local_78._M_p != local_68) {
          operator_delete(local_78._M_p);
        }
        if ((undefined1 *)local_a0._8_8_ != local_a0 + 0x18) {
          operator_delete((void *)local_a0._8_8_);
        }
        this_00 = this_00 + 1;
      } while (this_00 != pvVar1);
    }
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_a0._0_8_ = local_a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"incompatible type requested","");
  std::runtime_error::runtime_error(this,(string *)local_a0);
  *(undefined ***)this = &PTR__runtime_error_00120d78;
  __cxa_throw(this,&value_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static std::vector<U> extract_value(const value& val) {
        std::vector<U> v;
        const value_vector_type& inner_vals = val.get<value_vector_type>();
        for (const auto& u : inner_vals) {
            v.push_back(u.get<U>());
        }
        return v;
    }